

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O2

size_t __thiscall
BamTools::Internal::BgzfStream::Write(BgzfStream *this,char *data,size_t dataLength)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((this->m_device != (IBamIODevice *)0x0) &&
     (iVar1 = (*this->m_device->_vptr_IBamIODevice[10])(), (char)iVar1 != '\0')) {
    uVar4 = 0;
    while (uVar2 = dataLength - uVar4, uVar4 <= dataLength && uVar2 != 0) {
      uVar3 = 0x10000 - (long)this->m_blockOffset;
      if (uVar2 < uVar3) {
        uVar3 = uVar2;
      }
      uVar2 = uVar3 & 0xffffffff;
      memcpy((this->m_uncompressedBlock).Buffer + this->m_blockOffset,data,uVar2);
      iVar1 = (int)uVar3 + this->m_blockOffset;
      this->m_blockOffset = iVar1;
      data = data + uVar2;
      uVar4 = uVar4 + uVar2;
      if (iVar1 == 0x10000) {
        FlushBlock(this);
      }
    }
    return uVar4;
  }
  return 0;
}

Assistant:

std::size_t BgzfStream::Write(const char* data, const std::size_t dataLength)
{

    BT_ASSERT_X(m_device, "BgzfStream::Write() - trying to write to null IO device");
    BT_ASSERT_X((m_device->Mode() == IBamIODevice::WriteOnly),
                "BgzfStream::Write() - trying to write to non-writable IO device");

    // skip if file not open for writing
    if (!IsOpen()) return 0;

    // write blocks as needed til all data is written
    std::size_t numBytesWritten = 0;
    const char* input = data;
    const std::size_t blockLength = Constants::BGZF_DEFAULT_BLOCK_SIZE;
    while (numBytesWritten < dataLength) {

        // copy data contents to uncompressed output buffer
        unsigned int copyLength =
            std::min(blockLength - m_blockOffset, dataLength - numBytesWritten);
        char* buffer = m_uncompressedBlock.Buffer;
        memcpy(buffer + m_blockOffset, input, copyLength);

        // update counter
        m_blockOffset += copyLength;
        input += copyLength;
        numBytesWritten += copyLength;

        // flush (& compress) output buffer when full
        if (m_blockOffset == static_cast<int32_t>(blockLength)) FlushBlock();
    }

    // return actual number of bytes written
    return numBytesWritten;
}